

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O3

void __thiscall
wabt::anon_unknown_4::ScriptValidator::CheckTypeIndex
          (ScriptValidator *this,Location *loc,Type actual,Type expected,char *desc,Index index,
          char *index_kind)

{
  _Alloc_hider _Var1;
  Result RVar2;
  Type expected_local;
  Type actual_local;
  string local_70;
  string local_50;
  
  expected_local = expected;
  actual_local = actual;
  RVar2 = TypeChecker::CheckType(actual,expected);
  if (RVar2.enum_ == Error) {
    Type::GetName_abi_cxx11_(&local_50,&actual_local);
    _Var1._M_p = local_50._M_dataplus._M_p;
    Type::GetName_abi_cxx11_(&local_70,&expected_local);
    PrintError(this,loc,"type mismatch for %s %u of %s. got %s, expected %s",index_kind,index,desc,
               _Var1._M_p,local_70._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void ScriptValidator::CheckTypeIndex(const Location* loc,
                                     Type actual,
                                     Type expected,
                                     const char* desc,
                                     Index index,
                                     const char* index_kind) {
  if (Failed(TypeChecker::CheckType(actual, expected))) {
    PrintError(loc,
               "type mismatch for %s %" PRIindex " of %s. got %s, expected %s",
               index_kind, index, desc, actual.GetName().c_str(),
               expected.GetName().c_str());
  }
}